

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O0

string * __thiscall
CNscContext::GetDefineValue_abi_cxx11_(CNscContext *this,DefineEntry *psDefine,bool fSimpleOnly)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  NscSymbolFence *pNVar5;
  NscSymbol *pNVar6;
  byte in_DL;
  long in_RSI;
  CNscContext *in_RDI;
  NscSymbol *pSymbol;
  NscSymbolFence *pFunctionFence;
  char szCounter [32];
  char szLineNumber [32];
  size_t in_stack_ffffffffffffff68;
  char *__s;
  CNscContext *in_stack_ffffffffffffff70;
  vector<CNscContext::File,_std::allocator<CNscContext::File>_> *this_00;
  char local_68 [32];
  char local_48 [47];
  byte local_19;
  long local_18;
  string *local_8;
  
  local_19 = in_DL & 1;
  switch(*(undefined4 *)(in_RSI + 0x48)) {
  case 0:
    local_8 = (string *)(in_RSI + 0x28);
    break;
  case 1:
    local_18 = in_RSI;
    if (local_19 == 0) {
      GenerateMessage(in_RDI,NscMessage_ErrorFunctionLikeMacroNotImpl);
      local_8 = (string *)(local_18 + 0x28);
    }
    else {
      GenerateMessage(in_RDI,NscMessage_ErrorFunctionLikeMacroNotAllowed);
      local_8 = (string *)(local_18 + 0x28);
    }
    break;
  case 2:
    std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,"\"");
    this_00 = &in_RDI->m_asFiles;
    iVar3 = GetCurrentFile(in_RDI);
    pvVar4 = std::vector<CNscContext::File,_std::allocator<CNscContext::File>_>::operator[]
                       (this_00,(long)iVar3);
    std::__cxx11::string::operator+=((string *)&in_RDI->m_strDefineScratch,(string *)pvVar4);
    std::__cxx11::string::operator+=((string *)&in_RDI->m_strDefineScratch,"\"");
    local_8 = &in_RDI->m_strDefineScratch;
    break;
  case 3:
    __s = local_48;
    uVar2 = GetCurrentLine(in_RDI);
    snprintf(__s,0x20,"%d",(ulong)uVar2);
    std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,local_48);
    local_8 = &in_RDI->m_strDefineScratch;
    break;
  case 4:
    local_8 = &in_RDI->m_strCompileDate;
    break;
  case 5:
    local_8 = &in_RDI->m_strCompileTime;
    break;
  case 6:
    std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,"\"Apr 25 2025\"");
    local_8 = &in_RDI->m_strDefineScratch;
    break;
  case 7:
    std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,"\"21:55:44\"");
    local_8 = &in_RDI->m_strDefineScratch;
    break;
  case 8:
    snprintf(local_68,0x20,"%d",(ulong)(uint)in_RDI->m_nPreprocessorCounter);
    in_RDI->m_nPreprocessorCounter = in_RDI->m_nPreprocessorCounter + 1;
    std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,local_68);
    local_8 = &in_RDI->m_strDefineScratch;
    break;
  case 9:
    bVar1 = IsPhase2(in_RDI);
    if (bVar1) {
      pNVar5 = GetCurrentFunctionFence(in_RDI);
      if (pNVar5 == (NscSymbolFence *)0x0) {
        GenerateMessage(in_RDI,NscMessage_ErrorFuncNameMacroNotInFunction);
        std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,"\"\"");
        local_8 = &in_RDI->m_strDefineScratch;
      }
      else {
        pNVar6 = GetSymbol(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (pNVar6 == (NscSymbol *)0x0) {
          __assert_fail("pSymbol != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                        ,0xa27,
                        "const std::string *CNscContext::GetDefineValue(const DefineEntry *, bool)")
          ;
        }
        std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,"\"");
        std::__cxx11::string::operator+=((string *)&in_RDI->m_strDefineScratch,pNVar6->szString);
        std::__cxx11::string::operator+=((string *)&in_RDI->m_strDefineScratch,"\"");
        local_8 = &in_RDI->m_strDefineScratch;
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&in_RDI->m_strDefineScratch,"\"\"");
      local_8 = &in_RDI->m_strDefineScratch;
    }
    break;
  default:
    if ((GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::strEmpty_abi_cxx11_ ==
         '\0') &&
       (iVar3 = __cxa_guard_acquire(&GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)
                                     ::strEmpty_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::string::string
                ((string *)
                 GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::
                 strEmpty_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::
                   strEmpty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetDefineValue[abi:cxx11](CNscContext::DefineEntry_const*,bool)::
                           strEmpty_abi_cxx11_);
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                  ,0xa36,"const std::string *CNscContext::GetDefineValue(const DefineEntry *, bool)"
                 );
  }
  return local_8;
}

Assistant:

const std::string *CNscContext::GetDefineValue (const DefineEntry *psDefine,
	bool fSimpleOnly)
{
	switch (psDefine ->nMacro)
	{

		//
		// If the define is simple replacement
		//

	case NscMacro_Simple:
		return &psDefine ->strValue;

		//
		// If the define is a function-like macro
		//

	case NscMacro_FunctionLike:
		if (fSimpleOnly)
		{
			GenerateMessage (NscMessage_ErrorFunctionLikeMacroNotAllowed);
			return &psDefine ->strValue;
		}

		GenerateMessage (NscMessage_ErrorFunctionLikeMacroNotImpl);
		return &psDefine ->strValue;

		//
		// If the define is __FILE__
		//

	case NscMacro_File:
		m_strDefineScratch = "\"";
		m_strDefineScratch += m_asFiles [GetCurrentFile ()] .strName;
		m_strDefineScratch += "\"";
		return &m_strDefineScratch;

		//
		// If the define is __LINE__
		//

	case NscMacro_Line:
		{
			char szLineNumber [32];

			snprintf (szLineNumber, sizeof (szLineNumber), "%d",
				GetCurrentLine ());

			m_strDefineScratch = szLineNumber;

			return &m_strDefineScratch;
		}
		break;

		//
		// If the define is __DATE__
		//

	case NscMacro_Date:
		return &m_strCompileDate;

		//
		// If the define is __TIME__
		//

	case NscMacro_Time:
		return &m_strCompileTime;

		//
		// If the define is __NSC_COMPILER_DATE__
		//

	case NscMacro_NscCompilerDate:
		m_strDefineScratch = "\"" __DATE__ "\"";
		return &m_strDefineScratch;

		//
		// If the define is __NSC_COMPILER_TIME__
		//

	case NscMacro_NscCompilerTime:
		m_strDefineScratch = "\"" __TIME__ "\"";
		return &m_strDefineScratch;

		//
		// If the define is __COUNTER__
		//

	case NscMacro_Counter:
		{
			char szCounter [32];

			snprintf (szCounter, sizeof (szCounter), "%d",
				m_nPreprocessorCounter);
			m_nPreprocessorCounter += 1;
			m_strDefineScratch = szCounter;
			return &m_strDefineScratch;
		}
		break;

		//
		// If the define is __FUNCTION__
		//

	case NscMacro_Function:
		{

			//
			// If we don't have to process this
			//

			if (!IsPhase2 ())
			{
				m_strDefineScratch = "\"\"";
				return &m_strDefineScratch;
			}

			//
			// Get the current function name
			//

			NscSymbolFence *pFunctionFence = GetCurrentFunctionFence ();
			NscSymbol *pSymbol;

			if (pFunctionFence == NULL)
			{
				GenerateMessage (NscMessage_ErrorFuncNameMacroNotInFunction);
				m_strDefineScratch = "\"\"";
				return &m_strDefineScratch;
			}

			pSymbol = GetSymbol (pFunctionFence ->nFnSymbol);
			assert (pSymbol != NULL);

			m_strDefineScratch = "\"";
			m_strDefineScratch += pSymbol ->szString;
			m_strDefineScratch += "\"";
			return &m_strDefineScratch;
		}
		break;

		//
		// Otherwise we have a missing case (Nsc.h out of sync)
		//

	default:
		static const std::string strEmpty;
		assert (false);
		return &strEmpty;

	}
}